

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int session_update_stream_priority(nghttp2_session *session,nghttp2_stream *stream,uint8_t u8extpri)

{
  char in_DL;
  long in_RSI;
  nghttp2_stream *in_RDI;
  nghttp2_stream *in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(char *)(in_RSI + 0xdc) == in_DL) {
    iVar1 = 0;
  }
  else if (*(char *)(in_RSI + 0xda) == '\0') {
    *(char *)(in_RSI + 0xdc) = in_DL;
    iVar1 = 0;
  }
  else {
    session_ob_data_remove
              ((nghttp2_session *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    *(char *)(in_RSI + 0xdc) = in_DL;
    iVar1 = session_ob_data_push
                      ((nghttp2_session *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
  }
  return iVar1;
}

Assistant:

static int session_update_stream_priority(nghttp2_session *session,
                                          nghttp2_stream *stream,
                                          uint8_t u8extpri) {
  if (stream->extpri == u8extpri) {
    return 0;
  }

  if (stream->queued) {
    session_ob_data_remove(session, stream);

    stream->extpri = u8extpri;

    return session_ob_data_push(session, stream);
  }

  stream->extpri = u8extpri;

  return 0;
}